

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O3

void __thiscall
mjs::native_error_exception::native_error_exception
          (native_error_exception *this,native_error_type type,wstring_view *stack_trace,
          wstring_view *msg)

{
  size_t sVar1;
  wchar_t *pwVar2;
  char *__s;
  size_t sVar3;
  ostream *poVar4;
  ostringstream oss;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __s = type_string(type);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_1e8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x40);
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,": ",2);
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<wchar_t_const*>
            ((string *)&local_1e8,msg->_M_str,msg->_M_str + msg->_M_len);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_1e8,local_1e0);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  if (stack_trace->_M_len != 0) {
    local_1e8 = (long *)CONCAT71(local_1e8._1_7_,10);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_1e8,1);
    local_1e8 = local_1d8;
    std::__cxx11::string::_M_construct<wchar_t_const*>
              ((string *)&local_1e8,stack_trace->_M_str,stack_trace->_M_str + stack_trace->_M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_1e8,local_1e0);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::runtime_error::runtime_error((runtime_error *)this,(string *)local_1c8);
  *(undefined ***)&this->super_eval_exception = &PTR__runtime_error_001d4938;
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  *(undefined ***)&this->super_eval_exception = &PTR__native_error_exception_001d4218;
  this->type_ = type;
  sVar1 = msg->_M_len;
  pwVar2 = msg->_M_str;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&this->msg_,pwVar2,pwVar2 + sVar1);
  sVar1 = stack_trace->_M_len;
  pwVar2 = stack_trace->_M_str;
  (this->stack_trace_)._M_dataplus._M_p = (pointer)&(this->stack_trace_).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&this->stack_trace_,pwVar2,pwVar2 + sVar1);
  return;
}

Assistant:

native_error_exception::native_error_exception(native_error_type type, const std::wstring_view& stack_trace, const std::wstring_view& msg)
    : eval_exception{get_eval_exception_repr(type, stack_trace, msg)}
    , type_{type}
    , msg_{msg}
    , stack_trace_{stack_trace} {
}